

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O2

void vkt::pipeline::anon_unknown_0::initMultisamplePrograms
               (SourceCollections *sources,GeometryType geometryType)

{
  ostream *poVar1;
  ProgramSources *pPVar2;
  char *pcVar3;
  ostringstream vertexSource;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [40];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,
                           "#version 310 es\nlayout(location = 0) in vec4 position;\nlayout(location = 1) in vec4 color;\nlayout(location = 0) out highp vec4 vtxColor;\nvoid main (void)\n{\n\tgl_Position = position;\n\tvtxColor = color;\n"
                          );
  pcVar3 = "";
  if (geometryType == GEOMETRY_TYPE_OPAQUE_POINT) {
    pcVar3 = "\tgl_PointSize = 3.0f;\n";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"color_vert",&local_1fa);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&sources->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"color_frag",&local_1fa);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add(&sources->glslSources,&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "#version 310 es\nlayout(location = 0) in highp vec4 vtxColor;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vtxColor;\n}\n"
             ,&local_1f9);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void initMultisamplePrograms (SourceCollections& sources, GeometryType geometryType)
{
	std::ostringstream vertexSource;

	vertexSource <<
		"#version 310 es\n"
		"layout(location = 0) in vec4 position;\n"
		"layout(location = 1) in vec4 color;\n"
		"layout(location = 0) out highp vec4 vtxColor;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = position;\n"
		"	vtxColor = color;\n"
		<< (geometryType == GEOMETRY_TYPE_OPAQUE_POINT ? "	gl_PointSize = 3.0f;\n"
														 : "" )
		<< "}\n";

	static const char* fragmentSource =
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 vtxColor;\n"
		"layout(location = 0) out highp vec4 fragColor;\n"
		"void main (void)\n"
		"{\n"
		"	fragColor = vtxColor;\n"
		"}\n";

	sources.glslSources.add("color_vert") << glu::VertexSource(vertexSource.str());
	sources.glslSources.add("color_frag") << glu::FragmentSource(fragmentSource);
}